

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitMatrixIO.cpp
# Opt level: O0

string * ZXing::ToString_abi_cxx11_(BitMatrix *matrix,bool inverted)

{
  bool bVar1;
  int iVar2;
  const_reference ppcVar3;
  byte in_DL;
  BitMatrix *in_RSI;
  string *in_RDI;
  int bt;
  int tp;
  int x;
  int y;
  array<const_char_*,_4UL> map;
  string *res;
  int in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined2 in_stack_ffffffffffffff70;
  undefined1 in_stack_ffffffffffffff72;
  undefined1 in_stack_ffffffffffffff73;
  int in_stack_ffffffffffffff74;
  undefined4 local_50;
  undefined4 local_40;
  
  std::__cxx11::string::string((string *)in_RDI);
  for (local_40 = 0; iVar2 = BitMatrix::height(in_RSI), local_40 < iVar2; local_40 = local_40 + 2) {
    for (local_50 = 0; iVar2 = BitMatrix::width(in_RSI), local_50 < iVar2; local_50 = local_50 + 1)
    {
      bVar1 = BitMatrix::get((BitMatrix *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(in_stack_ffffffffffffff73,
                                               CONCAT12(in_stack_ffffffffffffff72,
                                                        in_stack_ffffffffffffff70))),
                             in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      iVar2 = BitMatrix::height(in_RSI);
      if ((iVar2 != 1) || (bVar1 == (bool)(in_DL & 1))) {
        in_stack_ffffffffffffff74 = local_40 + 1;
        iVar2 = BitMatrix::height(in_RSI);
        in_stack_ffffffffffffff73 = 0;
        if (in_stack_ffffffffffffff74 < iVar2) {
          in_stack_ffffffffffffff72 =
               BitMatrix::get((BitMatrix *)
                              CONCAT44(in_stack_ffffffffffffff74,
                                       (uint)CONCAT12(in_stack_ffffffffffffff72,
                                                      in_stack_ffffffffffffff70)),
                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
          in_stack_ffffffffffffff73 = in_stack_ffffffffffffff72 != (in_DL & 1);
        }
      }
      ppcVar3 = std::array<const_char_*,_4UL>::operator[]
                          ((array<const_char_*,_4UL> *)
                           CONCAT44(in_stack_ffffffffffffff74,
                                    CONCAT13(in_stack_ffffffffffffff73,
                                             CONCAT12(in_stack_ffffffffffffff72,
                                                      in_stack_ffffffffffffff70))),
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      std::__cxx11::string::operator+=((string *)in_RDI,*ppcVar3);
    }
    std::__cxx11::string::push_back((char)in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string ToString(const BitMatrix& matrix, bool inverted)
{
	constexpr auto map = std::array{" ", "▀", "▄", "█"};
	std::string res;

	for (int y = 0; y < matrix.height(); y += 2) {
		for (int x = 0; x < matrix.width(); ++x) {
			int tp = matrix.get(x, y) ^ inverted;
			int bt = (matrix.height() == 1 && tp) || (y + 1 < matrix.height() && (matrix.get(x, y + 1) ^ inverted));
			res += map[tp | (bt << 1)];
		}
		res.push_back('\n');
	}

	return res;
}